

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O1

void __thiscall
CheckedMutexTest_TryLockDeadlock_Test<yamc::checked::recursive_mutex>::TestBody
          (CheckedMutexTest_TryLockDeadlock_Test<yamc::checked::recursive_mutex> *this)

{
  anon_class_1_0_00000001 test_body;
  anon_class_1_0_00000001 local_1;
  
  TestBody::anon_class_1_0_00000001::operator()(&local_1);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, TryLockDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx1;
    TypeParam mtx2;
    yamc::test::task_runner(2, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_TRUE(mtx1.try_lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_TRUE(mtx2.try_lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}